

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

EventLogEntry * __thiscall
TTD::EventLog::RecordJsRTCallFunction
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,int32 rootDepth,Var funcVar,
          uint32 argCount,Var *args)

{
  EventLogEntry *evt;
  int64 topLevelCallbackEventTime;
  long callEventTime;
  JsRTCallFunctionAction *local_48;
  JsRTCallFunctionAction *cAction;
  uint32 local_34;
  
  local_48 = (JsRTCallFunctionAction *)0x0;
  cAction = (JsRTCallFunctionAction *)args;
  local_34 = argCount;
  evt = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                  (this,&local_48);
  callEventTime = this->m_eventTimeCtr + -1;
  topLevelCallbackEventTime = callEventTime;
  if (rootDepth != 0) {
    topLevelCallbackEventTime = this->m_topLevelCallbackEventTime;
  }
  NSLogEvents::JsRTCallFunctionAction_ProcessArgs
            (evt,rootDepth,callEventTime,funcVar,local_34,&cAction->Result,topLevelCallbackEventTime
             ,&this->m_eventSlabAllocator);
  NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre(evt,funcVar,&this->m_eventSlabAllocator);
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = evt;
    actionPopper->m_resultPtr = &local_48->Result;
    local_48->Result = (TTDVar)0x0;
    return evt;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

NSLogEvents::EventLogEntry* EventLog::RecordJsRTCallFunction(TTDJsRTActionResultAutoRecorder& actionPopper, int32 rootDepth, Js::Var funcVar, uint32 argCount, Js::Var* args)
    {
        NSLogEvents::JsRTCallFunctionAction* cAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(&cAction);

        int64 evtTime = this->GetLastEventTime();
        int64 topLevelCallTime = (rootDepth == 0) ? evtTime : this->m_topLevelCallbackEventTime;
        NSLogEvents::JsRTCallFunctionAction_ProcessArgs(evt, rootDepth, evtTime, funcVar, argCount, args, topLevelCallTime, this->m_eventSlabAllocator);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
        NSLogEvents::JsRTCallFunctionAction_ProcessDiagInfoPre(evt, funcVar, this->m_eventSlabAllocator);
#endif

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(cAction->Result));

        return evt;
    }